

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O2

void __thiscall MT32Emu::BReverbModelImpl<float>::mute(BReverbModelImpl<float> *this)

{
  Bit32u i;
  ulong uVar1;
  
  if (this->allpasses != (AllpassFilter<float> **)0x0) {
    for (uVar1 = 0; uVar1 < this->currentSettings->numberOfAllpasses; uVar1 = uVar1 + 1) {
      RingBuffer<float>::mute(&this->allpasses[uVar1]->super_RingBuffer<float>);
    }
  }
  if (this->combs != (CombFilter<float> **)0x0) {
    for (uVar1 = 0; uVar1 < this->currentSettings->numberOfCombs; uVar1 = uVar1 + 1) {
      RingBuffer<float>::mute(&this->combs[uVar1]->super_RingBuffer<float>);
    }
  }
  return;
}

Assistant:

void mute() {
		if (allpasses != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
				allpasses[i]->mute();
			}
		}
		if (combs != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfCombs; i++) {
				combs[i]->mute();
			}
		}
	}